

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gravity_compiler.c
# Opt level: O0

void internal_vm_cleanup(gravity_vm *vm)

{
  gravity_object_t *pgVar1;
  long lVar2;
  long lVar3;
  gravity_object_t *obj_00;
  void *pvVar4;
  gravity_class_t *c;
  gravity_object_t *obj;
  size_t i;
  size_t count;
  gravity_compiler_t *compiler;
  gravity_vm *vm_local;
  
  pvVar4 = gravity_vm_getdata(vm);
  pgVar1 = (gravity_object_t *)**(ulong **)((long)pvVar4 + 0x28);
  for (obj = (gravity_object_t *)0x0; obj < pgVar1; obj = (gravity_object_t *)((long)&obj->isa + 1))
  {
    lVar2 = *(long *)(*(long *)((long)pvVar4 + 0x28) + 0x10);
    lVar3 = **(long **)((long)pvVar4 + 0x28);
    **(long **)((long)pvVar4 + 0x28) = lVar3 + -1;
    obj_00 = *(gravity_object_t **)(lVar2 + -8 + lVar3 * 8);
    if (obj_00->isa == gravity_class_class) {
      gravity_hash_iterate(obj_00->htable,internal_free_class,(void *)0x0);
    }
    gravity_object_free(vm,obj_00);
  }
  return;
}

Assistant:

static void internal_vm_cleanup (gravity_vm *vm) {
    gravity_compiler_t *compiler = (gravity_compiler_t *)gravity_vm_getdata(vm);
    size_t count = marray_size(*compiler->objects);
    for (size_t i=0; i<count; ++i) {
        gravity_object_t *obj = marray_pop(*compiler->objects);
        if (OBJECT_ISA_CLASS(obj)) {
            gravity_class_t *c = (gravity_class_t *)obj;
            gravity_hash_iterate(c->htable, internal_free_class, NULL);
        }
        gravity_object_free(vm, obj);
    }
}